

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall cmCPackDebGenerator::PackageFiles(cmCPackDebGenerator *this)

{
  uint uVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmCPackDebGenerator *local_18;
  cmCPackDebGenerator *this_local;
  
  local_18 = this;
  uVar1 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    this_local._4_4_ = PackageComponentsAllInOne(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ALL_COMPONENTS_IN_ONE",&local_39);
    this_local._4_4_ = PackageComponentsAllInOne(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    this_local._4_4_ =
         PackageComponents(this,(this->super_cmCPackGenerator).componentPackageMethod ==
                                ONE_PACKAGE_PER_COMPONENT);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::PackageFiles()
{
  /* Are we in the component packaging case */
  if (this->WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL GROUPS or ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (this->componentPackageMethod == ONE_PACKAGE) {
      return this->PackageComponentsAllInOne("ALL_COMPONENTS_IN_ONE");
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return this->PackageComponents(this->componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
  }
  // CASE 3 : NON COMPONENT package.
  return this->PackageComponentsAllInOne("");
}